

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

uint16_t chipemu::implementation::anon_unknown_0::lookup_leg
                   (uint16_t *nodes,uint16_t id,uint16_t gate_node_off,transdef *tdef)

{
  uint16_t uVar1;
  logic_error *this;
  ushort local_3a;
  uint16_t *puStack_38;
  uint16_t i;
  uint16_t *leg;
  uint16_t count;
  transdef *tdef_local;
  uint16_t gate_node_off_local;
  uint16_t id_local;
  uint16_t *nodes_local;
  
  uVar1 = node_gate_count(nodes + (int)(uint)gate_node_off);
  puStack_38 = node_gates(nodes + (int)(uint)gate_node_off);
  local_3a = 0;
  while( true ) {
    if (uVar1 <= local_3a) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"building nodes");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (((int)(uint)*puStack_38 >> 1 == (uint)tdef->c1) &&
       ((int)(uint)puStack_38[1] >> 1 == (uint)tdef->c2)) break;
    local_3a = local_3a + 1;
    puStack_38 = puStack_38 + 2;
  }
  if ((int)(uint)*puStack_38 >> 1 == (uint)id) {
    nodes_local._6_2_ = (uint16_t)((long)puStack_38 + (2 - (long)nodes) >> 1);
  }
  else {
    nodes_local._6_2_ = (uint16_t)((long)puStack_38 - (long)nodes >> 1);
  }
  return nodes_local._6_2_;
}

Assistant:

static uint16_t
lookup_leg(uint16_t *nodes, uint16_t id,
           uint16_t gate_node_off, const struct transdef *tdef)
{
    uint16_t count = node_gate_count(nodes + gate_node_off);
    uint16_t *leg = node_gates(nodes + gate_node_off);
    for (uint16_t i = 0; i < count; ++i, leg += 2) {
        if (leg[0] >> 1 == tdef->c1 and leg[1] >> 1 == tdef->c2) {
            if (leg[0] >> 1 == id) {
                return leg + 1 - nodes;
            }
            else {
                return leg -  nodes;
            }
        }
    }
    throw std::logic_error("building nodes");
}